

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CamCal.cpp
# Opt level: O2

void on_mouse(int event,int x,int y,int flags,void *param_5)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = C2dPtSel::chkImgLd(&o2dPtSel);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: on_mouse(): frame image is unloaded");
    std::endl<char,std::char_traits<char>>(poVar2);
    return;
  }
  if (event == 1) {
    C2dPtSel::addNd(&o2dPtSel,x,y);
    return;
  }
  return;
}

Assistant:

void on_mouse(int event, int x, int y, int flags, void*)  // mouse event
{
	if (!o2dPtSel.chkImgLd())
	{
		std::cout << "Error: on_mouse(): frame image is unloaded" << std::endl;
		return;
	}

	if (event == cv::EVENT_FLAG_LBUTTON)
		o2dPtSel.addNd(x, y);

	return;
}